

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O2

__pid_t __thiscall ParallelManager::wait(ParallelManager *this,void *__stat_loc)

{
  __pid_t extraout_EAX;
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_20,&this->m_lock);
  std::condition_variable::wait<ParallelManager::wait()::_lambda()_1_>
            (&this->m_complete,&local_20,(anon_class_8_1_8991fb9c)this);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return extraout_EAX;
}

Assistant:

void wait()
	{
		std::unique_lock<std::mutex> lck(m_lock);
		m_complete.wait(lck, [this]{ return m_is_cancelled || m_done_count == m_task_count; });
	}